

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O2

bool __thiscall
Deque<int,_std::allocator<int>_>::
DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_>::operator<
          (DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *this,
          DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *other)

{
  runtime_error *this_00;
  
  if (this->deque_ == other->deque_) {
    return this->n_ < other->n_;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Container mismatch");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool operator <(const DequeIterator &other) const {
            if (deque_ != other.deque_) {
                throw std::runtime_error("Container mismatch");
            }
            return n_ < other.n_;
        }